

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int io_type(lua_State *L)

{
  void *pvVar1;
  LStream *p;
  lua_State *L_local;
  
  luaL_checkany(L,1);
  pvVar1 = luaL_testudata(L,1,"FILE*");
  if (pvVar1 == (void *)0x0) {
    lua_pushnil(L);
  }
  else if (*(long *)((long)pvVar1 + 8) == 0) {
    lua_pushstring(L,"closed file");
  }
  else {
    lua_pushstring(L,"file");
  }
  return 1;
}

Assistant:

static int io_type(lua_State *L) {
    LStream *p;
    luaL_checkany(L, 1);
    p = (LStream *) luaL_testudata(L, 1, LUA_FILEHANDLE);
    if (p == NULL)
        lua_pushnil(L);  /* not a file */
    else if (isclosed(p))
        lua_pushliteral(L, "closed file");
    else
        lua_pushliteral(L, "file");
    return 1;
}